

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O2

void parseACTFile(filebuf *file)

{
  long lVar1;
  ulong uVar2;
  uint3 *__s;
  ushort uVar3;
  bool bVar4;
  array<char,_772UL> buf;
  uint3 local_324 [192];
  ushort local_24;
  
  __s = local_324;
  memset(__s,0,0x304);
  lVar1 = (**(code **)(*(long *)file + 0x40))(file,__s,0x304);
  if (lVar1 == 0x300) {
    uVar3 = 0x100;
  }
  else {
    if (lVar1 != 0x304) {
      error("Invalid file size for ACT file (expected 768 or 772 bytes, got %zu",lVar1);
      return;
    }
    uVar3 = local_24 << 8 | local_24 >> 8;
    if ((ushort)(uVar3 - 0x101) < 0xff00) {
      error("Invalid number of colors in ACT file (%u)",(ulong)uVar3);
      return;
    }
  }
  if ((ushort)((ushort)options.nbPalettes * (ushort)options.nbColorsPerPal) < uVar3) {
    warning("ACT file contains %u colors, but there can only be %u; ignoring extra");
    uVar3 = (ushort)options.nbPalettes * (ushort)options.nbColorsPerPal;
  }
  if (options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      options.palSpec.
      super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::emplace_back<>
            (&options.palSpec);
  uVar2 = 0;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish[-1]._M_elems[uVar2] = (Rgba)(*__s | 0xff000000);
    uVar2 = uVar2 + 1;
    if (uVar2 == options.nbColorsPerPal) {
      std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::emplace_back<>
                (&options.palSpec);
      uVar2 = 0;
    }
    __s = (uint3 *)((long)__s + 3);
  }
  if (uVar2 == 0) {
    options.palSpec.
    super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         options.palSpec.
         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  return;
}

Assistant:

static void parseACTFile(std::filebuf &file) {
	// https://www.adobe.com/devnet-apps/photoshop/fileformatashtml/#50577411_pgfId-1070626

	std::array<char, 772> buf{};
	auto len = file.sgetn(buf.data(), buf.size());

	uint16_t nbColors = 256;
	if (len == 772) {
		nbColors = readBE<uint16_t>(&buf[768]);
		// TODO: apparently there is a "transparent color index"? What?
		if (nbColors > 256 || nbColors == 0) {
			error("Invalid number of colors in ACT file (%" PRIu16 ")", nbColors);
			return;
		}
	} else if (len != 768) {
		error("Invalid file size for ACT file (expected 768 or 772 bytes, got %zu", len);
		return;
	}

	if (nbColors > options.nbColorsPerPal * options.nbPalettes) {
		warning("ACT file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, options.nbColorsPerPal * options.nbPalettes);
		nbColors = options.nbColorsPerPal * options.nbPalettes;
	}

	options.palSpec.clear();
	options.palSpec.emplace_back();

	char const *ptr = buf.data();
	size_t colorIdx = 0;
	for (uint16_t i = 0; i < nbColors; ++i) {
		Rgba &color = options.palSpec.back()[colorIdx];
		color = Rgba(ptr[0], ptr[1], ptr[2], 0xFF);

		ptr += 3;
		++colorIdx;
		if (colorIdx == options.nbColorsPerPal) {
			options.palSpec.emplace_back();
			colorIdx = 0;
		}
	}

	// Remove the spurious empty palette if there is one
	if (colorIdx == 0) {
		options.palSpec.pop_back();
	}
}